

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[18],kj::String&,char_const(&)[51],kj::String&,char_const(&)[12]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [18],
          String *params_2,char (*params_3) [51],String *params_4,char (*params_5) [12])

{
  StringTree *pSVar1;
  char (*value) [18];
  String *pSVar2;
  char (*value_00) [51];
  char (*value_01) [12];
  StringTree *__return_storage_ptr___00;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  String *local_38;
  String *params_local_4;
  char (*params_local_3) [51];
  String *params_local_2;
  char (*params_local_1) [18];
  StringTree *params_local;
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = (String *)params_3;
  params_local_4 = params_2;
  params_local_3 = (char (*) [51])params_1;
  params_local_2 = (String *)params;
  params_local_1 = (char (*) [18])this;
  params_local = __return_storage_ptr__;
  pSVar1 = fwd<kj::StringTree>((NoInfer<kj::StringTree> *)this);
  pSVar1 = _::toStringTreeOrCharSequence(pSVar1);
  value = ::const((char (*) [18])params_local_2);
  local_48 = _::toStringTreeOrCharSequence<char_const(&)[18]>(value);
  pSVar2 = fwd<kj::String&>((String *)params_local_3);
  local_58 = _::toStringTreeOrCharSequence<kj::String&>(pSVar2);
  value_00 = ::const((char (*) [51])params_local_4);
  local_68 = _::toStringTreeOrCharSequence<char_const(&)[51]>(value_00);
  pSVar2 = fwd<kj::String&>(local_38);
  local_78 = _::toStringTreeOrCharSequence<kj::String&>(pSVar2);
  value_01 = ::const((char (*) [12])params_4);
  local_88 = _::toStringTreeOrCharSequence<char_const(&)[12]>(value_01);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr___00,pSVar1,(StringTree *)&local_48,&local_58,&local_68,&local_78,
             &local_88,(ArrayPtr<const_char> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}